

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitMessageSendNode
          (MethodSemanticAnalysis *this,MessageSendNode *node)

{
  bool bVar1;
  uint uVar2;
  CompilerOptimizedSelector selectorId;
  Node *pNVar3;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *this_00
  ;
  Oop selector_00;
  size_type sVar4;
  const_reference ppMVar5;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *this_01;
  reference ppNVar6;
  MessageSendNode *local_a8;
  Node **arg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__range2;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *arguments;
  value_type message;
  int i;
  CompilerOptimizedSelector optimizedSelector;
  Oop selector;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *chained
  ;
  bool isSuperSend;
  MessageSendNode *node_local;
  MethodSemanticAnalysis *this_local;
  
  pNVar3 = AST::MessageSendNode::getReceiver(node);
  uVar2 = (*pNVar3->_vptr_Node[7])();
  this_00 = AST::MessageSendNode::getChainedMessages(node);
  if (((uVar2 & 1) == 0) &&
     (bVar1 = std::
              vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
              ::empty(this_00), bVar1)) {
    selector_00 = AST::MessageSendNode::getSelectorOop(node);
    selectorId = VMContext::getCompilerOptimizedSelectorId
                           ((this->super_ScopedInterpreter).context,selector_00);
    if ((selectorId != Invalid) && (bVar1 = optimizeMessage(this,node,selectorId), bVar1)) {
      Oop::Oop((Oop *)&this_local);
      return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
    }
  }
  pNVar3 = AST::MessageSendNode::getReceiver(node);
  (*pNVar3->_vptr_Node[2])(pNVar3,this);
  for (message._4_4_ = -1;
      sVar4 = std::
              vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
              ::size(this_00), message._4_4_ < (int)sVar4; message._4_4_ = message._4_4_ + 1) {
    local_a8 = node;
    if (-1 < message._4_4_) {
      ppMVar5 = std::
                vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                ::operator[](this_00,(long)message._4_4_);
      local_a8 = *ppMVar5;
    }
    this_01 = AST::MessageSendNode::getArguments(local_a8);
    __end2 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::begin
                       (this_01);
    arg = (Node **)std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::end
                             (this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
                                       *)&arg), bVar1) {
      ppNVar6 = __gnu_cxx::
                __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
                ::operator*(&__end2);
      (*(*ppNVar6)->_vptr_Node[2])(*ppNVar6,this);
      __gnu_cxx::
      __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
      ::operator++(&__end2);
    }
  }
  Oop::Oop((Oop *)&this_local);
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop MethodSemanticAnalysis::visitMessageSendNode(MessageSendNode *node)
{
    auto isSuperSend = node->getReceiver()->isSuperReference();

	// Visit the arguments in reverse order.
	auto &chained = node->getChainedMessages();

    // Only try to optimize some message when they aren't in a chain.
    if(!isSuperSend && chained.empty())
    {
        auto selector = node->getSelectorOop();

        // If this is an optimized message, implement inlined.
        auto optimizedSelector = context->getCompilerOptimizedSelectorId(selector);
        if(optimizedSelector != CompilerOptimizedSelector::Invalid)
        {
            if(optimizeMessage(node, optimizedSelector))
                return Oop();
        }
    }

    // Visit the receiver.
	node->getReceiver()->acceptVisitor(this);

	// Send each message in the chain
	for(int i = -1; i < (int)chained.size(); ++i)
	{
		auto message = i < 0 ? node : chained[i];

		// Visit the arguments.
		auto &arguments = message->getArguments();
		for(auto &arg : arguments)
			arg->acceptVisitor(this);
	}

	return Oop();
}